

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void BeginVisitBlock(ParseNodeBlock *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  bool bVar1;
  uint uVar2;
  Scope *innerScope;
  
  bVar1 = BlockHasOwnScope(pnode,byteCodeGenerator);
  if (bVar1) {
    innerScope = pnode->scope;
    if ((innerScope->scopeType < ScopeType_With) &&
       ((0xe4U >> (innerScope->scopeType & 0x1f) & 1) != 0)) {
      uVar2 = FuncInfo::AcquireInnerScopeIndex(innerScope->func);
      innerScope->innerScopeIndex = uVar2;
      innerScope = pnode->scope;
    }
    pnode->enclosingBlock = byteCodeGenerator->currentBlock;
    byteCodeGenerator->currentBlock = pnode;
    ByteCodeGenerator::PushScope(byteCodeGenerator,innerScope);
    return;
  }
  return;
}

Assistant:

void BeginVisitBlock(ParseNodeBlock *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    if (BlockHasOwnScope(pnode, byteCodeGenerator))
    {
        Scope *scope = pnode->scope;
        FuncInfo *func = scope->GetFunc();

        if (scope->IsInnerScope())
        {
            // Give this scope an index so its slots can be accessed via the index in the byte code,
            // not a register.
            scope->SetInnerScopeIndex(func->AcquireInnerScopeIndex());
        }

        byteCodeGenerator->PushBlock(pnode);
        byteCodeGenerator->PushScope(pnode->scope);
    }
}